

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O3

void __thiscall OpenMD::Velocitizer::removeComDrift(Velocitizer *this)

{
  double *pdVar1;
  int iVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  Molecule *pMVar5;
  pointer ppSVar6;
  uint i;
  long lVar7;
  MoleculeIterator mi;
  Vector<double,_3U> result;
  Vector3d vdrift;
  MoleculeIterator local_70;
  double local_68 [4];
  double local_48 [4];
  Vector3d local_28;
  
  Thermo::getComVel(&local_28,&this->thermo_);
  local_70._M_node = (_Base_ptr)0x0;
  pMVar5 = SimInfo::beginMolecule(this->info_,&local_70);
  if (pMVar5 != (Molecule *)0x0) {
    do {
      ppSVar3 = (pMVar5->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar6 = (pMVar5->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar6 != ppSVar3 && (pSVar4 = *ppSVar6, pSVar4 != (StuntDouble *)0x0));
          ppSVar6 = ppSVar6 + 1) {
        lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
        local_48[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar7 + (long)pSVar4->localIndex_ * 0x18);
        local_48[0] = *pdVar1;
        local_48[1] = pdVar1[1];
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        lVar7 = 0;
        do {
          local_68[lVar7] = local_48[lVar7] - local_28.super_Vector<double,_3U>.data_[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        iVar2 = pSVar4->localIndex_;
        lVar7 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
        *(double *)(lVar7 + 0x10 + (long)iVar2 * 0x18) = local_68[2];
        pdVar1 = (double *)(lVar7 + (long)iVar2 * 0x18);
        *pdVar1 = local_68[0];
        pdVar1[1] = local_68[1];
      }
      pMVar5 = SimInfo::nextMolecule(this->info_,&local_70);
    } while (pMVar5 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Velocitizer::removeComDrift() {
    // Get the Center of Mass drift velocity.
    Vector3d vdrift = thermo_.getComVel();

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    //  Corrects for the center of mass drift.
    // sums all the momentum and divides by total mass.
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        sd->setVel(sd->getVel() - vdrift);
      }
    }
  }